

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

bool __thiscall cmGlobalGenerator::ComputeTargetDepends(cmGlobalGenerator *this)

{
  cmGeneratorTarget *t;
  bool bVar1;
  mapped_type *deps;
  pointer ppcVar2;
  cmGeneratorTarget *target;
  cmComputeTargetDepends ctd;
  cmGeneratorTarget *local_f0;
  cmComputeTargetDepends local_e8;
  
  cmComputeTargetDepends::cmComputeTargetDepends(&local_e8,this);
  bVar1 = cmComputeTargetDepends::Compute(&local_e8);
  if (bVar1) {
    if (local_e8.Targets.
        super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_e8.Targets.
        super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      ppcVar2 = local_e8.Targets.
                super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        t = *ppcVar2;
        local_f0 = t;
        deps = std::
               map<const_cmGeneratorTarget_*,_cmTargetDependSet,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmTargetDependSet>_>_>
               ::operator[](&this->TargetDependencies,&local_f0);
        cmComputeTargetDepends::GetTargetDirectDepends(&local_e8,t,deps);
        ppcVar2 = ppcVar2 + 1;
      } while (ppcVar2 !=
               local_e8.Targets.
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  cmComputeTargetDepends::~cmComputeTargetDepends(&local_e8);
  return bVar1;
}

Assistant:

bool cmGlobalGenerator::ComputeTargetDepends()
{
  cmComputeTargetDepends ctd(this);
  if (!ctd.Compute()) {
    return false;
  }
  for (cmGeneratorTarget const* target : ctd.GetTargets()) {
    ctd.GetTargetDirectDepends(target, this->TargetDependencies[target]);
  }
  return true;
}